

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O1

void __thiscall
duckdb::ReservoirQuantileState<duckdb::hugeint_t>::FillReservoir
          (ReservoirQuantileState<duckdb::hugeint_t> *this,idx_t sample_size,hugeint_t element)

{
  ulong uVar1;
  hugeint_t *phVar2;
  BaseReservoirSampling *this_00;
  idx_t iVar3;
  
  uVar1 = this->pos;
  if (uVar1 < sample_size) {
    phVar2 = this->v;
    this->pos = uVar1 + 1;
    phVar2[uVar1].lower = element.lower;
    phVar2[uVar1].upper = element.upper;
    BaseReservoirSampling::InitializeReservoirWeights(this->r_samp,this->pos,this->len);
    return;
  }
  this_00 = this->r_samp;
  if (this_00->next_index_to_sample == this_00->num_entries_to_skip_b4_next_sample) {
    phVar2 = this->v;
    iVar3 = this_00->min_weighted_entry_index;
    phVar2[iVar3].lower = element.lower;
    phVar2[iVar3].upper = element.upper;
    BaseReservoirSampling::ReplaceElement(this_00,-1.0);
    return;
  }
  return;
}

Assistant:

void FillReservoir(idx_t sample_size, T element) {
		if (pos < sample_size) {
			v[pos++] = element;
			r_samp->InitializeReservoirWeights(pos, len);
		} else {
			D_ASSERT(r_samp->next_index_to_sample >= r_samp->num_entries_to_skip_b4_next_sample);
			if (r_samp->next_index_to_sample == r_samp->num_entries_to_skip_b4_next_sample) {
				ReplaceElement(element);
			}
		}
	}